

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zstd_compress.c
# Opt level: O0

size_t ZSTD_copySequencesToSeqStoreNoBlockDelim
                 (ZSTD_CCtx *cctx,ZSTD_sequencePosition *seqPos,ZSTD_Sequence *inSeqs,
                 size_t inSeqsSize,void *src,size_t blockSize,ZSTD_paramSwitch_e externalRepSearch)

{
  undefined4 rawOffset_00;
  ZSTD_compressedBlockState_t *pZVar1;
  undefined4 uVar3;
  BYTE *pBVar2;
  bool bVar4;
  bool bVar5;
  U32 offBase_00;
  uint uVar6;
  ZSTD_Sequence *pZVar7;
  size_t code;
  long lVar8;
  ulong uVar9;
  BYTE *dst;
  seqStore_t *psVar10;
  U32 local_144;
  U32 lastLLSize;
  size_t err_code;
  U32 ll0;
  U32 secondHalfMatchLength;
  U32 firstHalfMatchLength;
  U32 offBase;
  U32 rawOffset;
  U32 matchLength;
  U32 litLength;
  ZSTD_Sequence currSeq;
  U32 finalMatchSplit;
  U32 bytesAdjustment;
  repcodes_t updatedRepcodes;
  BYTE *iend;
  BYTE *ip;
  size_t dictSize;
  uint local_d0;
  U32 endPosInSequence;
  U32 startPosInSequence;
  U32 idx;
  size_t blockSize_local;
  void *src_local;
  size_t inSeqsSize_local;
  ZSTD_Sequence *inSeqs_local;
  ZSTD_sequencePosition *seqPos_local;
  ZSTD_CCtx *cctx_local;
  size_t mlBase;
  BYTE *litEnd;
  BYTE *litLimit_w;
  BYTE *oend;
  BYTE *op;
  BYTE *ip_1;
  ptrdiff_t diff;
  
  endPosInSequence = seqPos->idx;
  local_d0 = seqPos->posInSequence;
  dictSize._4_4_ = seqPos->posInSequence + (int)blockSize;
  updatedRepcodes.rep._4_8_ = (long)src + blockSize;
  currSeq.rep = 0;
  bVar4 = false;
  if (cctx->cdict == (ZSTD_CDict *)0x0) {
    if ((cctx->prefixDict).dict == (void *)0x0) {
      ip = (BYTE *)0x0;
    }
    else {
      ip = (BYTE *)(cctx->prefixDict).dictSize;
    }
  }
  else {
    ip = (BYTE *)cctx->cdict->dictContentSize;
  }
  pZVar1 = (cctx->blockState).prevCBlock;
  _finalMatchSplit = *(undefined8 *)pZVar1->rep;
  updatedRepcodes.rep[0] = pZVar1->rep[2];
  iend = (BYTE *)src;
  do {
    bVar5 = false;
    if ((dictSize._4_4_ != 0) && (bVar5 = false, endPosInSequence < inSeqsSize)) {
      bVar5 = !bVar4;
    }
    if (!bVar5) goto LAB_00256f08;
    pZVar7 = inSeqs + endPosInSequence;
    rawOffset_00 = pZVar7->offset;
    uVar3 = pZVar7->litLength;
    uVar9._0_4_ = pZVar7->matchLength;
    uVar9._4_4_ = pZVar7->rep;
    offBase = (undefined4)uVar9;
    if (dictSize._4_4_ < (uint)(uVar3 + (undefined4)uVar9)) {
      if (dictSize._4_4_ <= (uint)uVar3) {
LAB_00256f08:
        if ((endPosInSequence != inSeqsSize) &&
           (inSeqs[endPosInSequence].litLength + inSeqs[endPosInSequence].matchLength <
            dictSize._4_4_)) {
          __assert_fail("idx == inSeqsSize || endPosInSequence <= inSeqs[idx].litLength + inSeqs[idx].matchLength"
                        ,
                        "/workspace/llm4binary/github/license_all_cmakelists_25/JeremieA[P]CMake/Utilities/cmzstd/lib/compress/zstd_compress.c"
                        ,0x19b7,
                        "size_t ZSTD_copySequencesToSeqStoreNoBlockDelim(ZSTD_CCtx *, ZSTD_sequencePosition *, const ZSTD_Sequence *const, size_t, const void *, size_t, ZSTD_paramSwitch_e)"
                       );
        }
        seqPos->idx = endPosInSequence;
        seqPos->posInSequence = dictSize._4_4_;
        pZVar1 = (cctx->blockState).nextCBlock;
        *(undefined8 *)pZVar1->rep = _finalMatchSplit;
        pZVar1->rep[2] = updatedRepcodes.rep[0];
        updatedRepcodes.rep._4_8_ = updatedRepcodes.rep._4_8_ - (ulong)currSeq.rep;
        if (iend != (BYTE *)updatedRepcodes.rep._4_8_) {
          uVar6 = (int)updatedRepcodes.rep._4_8_ - (int)iend;
          if ((ulong)updatedRepcodes.rep._4_8_ < iend) {
            __assert_fail("ip <= iend",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/JeremieA[P]CMake/Utilities/cmzstd/lib/compress/zstd_compress.c"
                          ,0x19c0,
                          "size_t ZSTD_copySequencesToSeqStoreNoBlockDelim(ZSTD_CCtx *, ZSTD_sequencePosition *, const ZSTD_Sequence *const, size_t, const void *, size_t, ZSTD_paramSwitch_e)"
                         );
          }
          ZSTD_storeLastLiterals(&cctx->seqStore,iend,(ulong)uVar6);
          seqPos->posInSrc = (ulong)uVar6 + seqPos->posInSrc;
        }
        return (ulong)currSeq.rep;
      }
      if (local_d0 < (uint)uVar3) {
        local_144 = uVar3 - local_d0;
      }
      else {
        local_144 = 0;
      }
      rawOffset = local_144;
      ll0 = (dictSize._4_4_ - local_d0) - local_144;
      if (((uVar9 & 0xffffffff) <= blockSize) || (ll0 < (cctx->appliedParams).cParams.minMatch)) {
        currSeq.rep = dictSize._4_4_ - uVar3;
        dictSize._4_4_ = uVar3;
        goto LAB_00256f08;
      }
      uVar6 = ((undefined4)uVar9 + uVar3) - dictSize._4_4_;
      if (uVar6 < (cctx->appliedParams).cParams.minMatch) {
        dictSize._4_4_ = dictSize._4_4_ - ((cctx->appliedParams).cParams.minMatch - uVar6);
        currSeq.rep = (cctx->appliedParams).cParams.minMatch - uVar6;
        ll0 = ll0 - currSeq.rep;
      }
      offBase = ll0;
      bVar4 = true;
    }
    else {
      if (local_d0 < (uint)uVar3) {
        rawOffset = uVar3 - local_d0;
      }
      else {
        rawOffset = 0;
        offBase = (undefined4)uVar9 - (local_d0 - uVar3);
      }
      dictSize._4_4_ = dictSize._4_4_ - (uVar3 + (undefined4)uVar9);
      local_d0 = 0;
    }
    offBase_00 = ZSTD_finalizeOffBase(rawOffset_00,&finalMatchSplit,(uint)(rawOffset == 0));
    ZSTD_updateRep(&finalMatchSplit,offBase_00,(uint)(rawOffset == 0));
    if ((cctx->appliedParams).validateSequences != 0) {
      seqPos->posInSrc = (ulong)(rawOffset + offBase) + seqPos->posInSrc;
      code = ZSTD_validateSequence
                       (offBase_00,offBase,(cctx->appliedParams).cParams.minMatch,seqPos->posInSrc,
                        (cctx->appliedParams).cParams.windowLog,(size_t)ip,
                        (cctx->appliedParams).useSequenceProducer);
      uVar6 = ERR_isError(code);
      if (uVar6 != 0) {
        return code;
      }
    }
    if ((cctx->seqStore).maxNbSeq <= (ulong)(endPosInSequence - seqPos->idx)) {
      return 0xffffffffffffff95;
    }
    psVar10 = &cctx->seqStore;
    uVar9 = (ulong)rawOffset;
    if ((cctx->seqStore).maxNbSeq <=
        (ulong)((long)(cctx->seqStore).sequences - (long)psVar10->sequencesStart >> 3)) {
      __assert_fail("(size_t)(seqStorePtr->sequences - seqStorePtr->sequencesStart) < seqStorePtr->maxNbSeq"
                    ,
                    "/workspace/llm4binary/github/license_all_cmakelists_25/JeremieA[P]CMake/Utilities/cmzstd/lib/compress/zstd_compress_internal.h"
                    ,0x29d,
                    "void ZSTD_storeSeq(seqStore_t *, size_t, const BYTE *, const BYTE *, U32, size_t)"
                   );
    }
    if (0x20000 < (cctx->seqStore).maxNbLit) {
      __assert_fail("seqStorePtr->maxNbLit <= 128 KB",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/JeremieA[P]CMake/Utilities/cmzstd/lib/compress/zstd_compress_internal.h"
                    ,0x29f,
                    "void ZSTD_storeSeq(seqStore_t *, size_t, const BYTE *, const BYTE *, U32, size_t)"
                   );
    }
    if ((cctx->seqStore).litStart + (cctx->seqStore).maxNbLit < (cctx->seqStore).lit + uVar9) {
      __assert_fail("seqStorePtr->lit + litLength <= seqStorePtr->litStart + seqStorePtr->maxNbLit",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/JeremieA[P]CMake/Utilities/cmzstd/lib/compress/zstd_compress_internal.h"
                    ,0x2a0,
                    "void ZSTD_storeSeq(seqStore_t *, size_t, const BYTE *, const BYTE *, U32, size_t)"
                   );
    }
    if ((ulong)updatedRepcodes.rep._4_8_ < iend + uVar9) {
      __assert_fail("literals + litLength <= litLimit",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/JeremieA[P]CMake/Utilities/cmzstd/lib/compress/zstd_compress_internal.h"
                    ,0x2a1,
                    "void ZSTD_storeSeq(seqStore_t *, size_t, const BYTE *, const BYTE *, U32, size_t)"
                   );
    }
    if ((BYTE *)(updatedRepcodes.rep._4_8_ + -0x20) < iend + uVar9) {
      ZSTD_safecopyLiterals
                ((cctx->seqStore).lit,iend,iend + uVar9,(BYTE *)(updatedRepcodes.rep._4_8_ + -0x20))
      ;
    }
    else {
      ZSTD_copy16((cctx->seqStore).lit,iend);
      if (0x10 < uVar9) {
        pBVar2 = (cctx->seqStore).lit;
        dst = pBVar2 + 0x10;
        lVar8 = (long)dst - (long)(iend + 0x10);
        if ((lVar8 < 0x10) && (-0x10 < lVar8)) {
          __assert_fail("diff >= WILDCOPY_VECLEN || diff <= -WILDCOPY_VECLEN",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/JeremieA[P]CMake/Utilities/cmzstd/lib/compress/../common/zstd_internal.h"
                        ,0xe9,
                        "void ZSTD_wildcopy(void *, const void *, ptrdiff_t, const ZSTD_overlap_e)")
          ;
        }
        ZSTD_copy16(dst,iend + 0x10);
        if (0x10 < (long)(uVar9 - 0x10)) {
          oend = pBVar2 + 0x20;
          pBVar2 = iend;
          do {
            op = pBVar2 + 0x20;
            ZSTD_copy16(oend,op);
            ZSTD_copy16(oend + 0x10,pBVar2 + 0x30);
            oend = oend + 0x20;
            pBVar2 = op;
          } while (oend < dst + (uVar9 - 0x10));
        }
      }
    }
    (cctx->seqStore).lit = (cctx->seqStore).lit + uVar9;
    if (0xffff < uVar9) {
      if ((cctx->seqStore).longLengthType != ZSTD_llt_none) {
        __assert_fail("seqStorePtr->longLengthType == ZSTD_llt_none",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/JeremieA[P]CMake/Utilities/cmzstd/lib/compress/zstd_compress_internal.h"
                      ,0x2b2,
                      "void ZSTD_storeSeq(seqStore_t *, size_t, const BYTE *, const BYTE *, U32, size_t)"
                     );
      }
      (cctx->seqStore).longLengthType = ZSTD_llt_literalLength;
      (cctx->seqStore).longLengthPos =
           (U32)((long)(cctx->seqStore).sequences - (long)psVar10->sequencesStart >> 3);
    }
    ((cctx->seqStore).sequences)->litLength = (U16)rawOffset;
    ((cctx->seqStore).sequences)->offBase = offBase_00;
    if ((ulong)offBase < 3) {
      __assert_fail("matchLength >= MINMATCH",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/JeremieA[P]CMake/Utilities/cmzstd/lib/compress/zstd_compress_internal.h"
                    ,700,
                    "void ZSTD_storeSeq(seqStore_t *, size_t, const BYTE *, const BYTE *, U32, size_t)"
                   );
    }
    uVar9 = (ulong)offBase - 3;
    if (0xffff < uVar9) {
      if ((cctx->seqStore).longLengthType != ZSTD_llt_none) {
        __assert_fail("seqStorePtr->longLengthType == ZSTD_llt_none",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/JeremieA[P]CMake/Utilities/cmzstd/lib/compress/zstd_compress_internal.h"
                      ,0x2bf,
                      "void ZSTD_storeSeq(seqStore_t *, size_t, const BYTE *, const BYTE *, U32, size_t)"
                     );
      }
      (cctx->seqStore).longLengthType = ZSTD_llt_matchLength;
      (cctx->seqStore).longLengthPos =
           (U32)((long)(cctx->seqStore).sequences - (long)psVar10->sequencesStart >> 3);
    }
    ((cctx->seqStore).sequences)->mlBase = (U16)uVar9;
    (cctx->seqStore).sequences = (cctx->seqStore).sequences + 1;
    iend = iend + (offBase + rawOffset);
    if (!bVar4) {
      endPosInSequence = endPosInSequence + 1;
    }
  } while( true );
}

Assistant:

size_t
ZSTD_copySequencesToSeqStoreNoBlockDelim(ZSTD_CCtx* cctx, ZSTD_sequencePosition* seqPos,
                                   const ZSTD_Sequence* const inSeqs, size_t inSeqsSize,
                                   const void* src, size_t blockSize, ZSTD_paramSwitch_e externalRepSearch)
{
    U32 idx = seqPos->idx;
    U32 startPosInSequence = seqPos->posInSequence;
    U32 endPosInSequence = seqPos->posInSequence + (U32)blockSize;
    size_t dictSize;
    BYTE const* ip = (BYTE const*)(src);
    BYTE const* iend = ip + blockSize;  /* May be adjusted if we decide to process fewer than blockSize bytes */
    repcodes_t updatedRepcodes;
    U32 bytesAdjustment = 0;
    U32 finalMatchSplit = 0;

    /* TODO(embg) support fast parsing mode in noBlockDelim mode */
    (void)externalRepSearch;

    if (cctx->cdict) {
        dictSize = cctx->cdict->dictContentSize;
    } else if (cctx->prefixDict.dict) {
        dictSize = cctx->prefixDict.dictSize;
    } else {
        dictSize = 0;
    }
    DEBUGLOG(5, "ZSTD_copySequencesToSeqStoreNoBlockDelim: idx: %u PIS: %u blockSize: %zu", idx, startPosInSequence, blockSize);
    DEBUGLOG(5, "Start seq: idx: %u (of: %u ml: %u ll: %u)", idx, inSeqs[idx].offset, inSeqs[idx].matchLength, inSeqs[idx].litLength);
    ZSTD_memcpy(updatedRepcodes.rep, cctx->blockState.prevCBlock->rep, sizeof(repcodes_t));
    while (endPosInSequence && idx < inSeqsSize && !finalMatchSplit) {
        const ZSTD_Sequence currSeq = inSeqs[idx];
        U32 litLength = currSeq.litLength;
        U32 matchLength = currSeq.matchLength;
        U32 const rawOffset = currSeq.offset;
        U32 offBase;

        /* Modify the sequence depending on where endPosInSequence lies */
        if (endPosInSequence >= currSeq.litLength + currSeq.matchLength) {
            if (startPosInSequence >= litLength) {
                startPosInSequence -= litLength;
                litLength = 0;
                matchLength -= startPosInSequence;
            } else {
                litLength -= startPosInSequence;
            }
            /* Move to the next sequence */
            endPosInSequence -= currSeq.litLength + currSeq.matchLength;
            startPosInSequence = 0;
        } else {
            /* This is the final (partial) sequence we're adding from inSeqs, and endPosInSequence
               does not reach the end of the match. So, we have to split the sequence */
            DEBUGLOG(6, "Require a split: diff: %u, idx: %u PIS: %u",
                     currSeq.litLength + currSeq.matchLength - endPosInSequence, idx, endPosInSequence);
            if (endPosInSequence > litLength) {
                U32 firstHalfMatchLength;
                litLength = startPosInSequence >= litLength ? 0 : litLength - startPosInSequence;
                firstHalfMatchLength = endPosInSequence - startPosInSequence - litLength;
                if (matchLength > blockSize && firstHalfMatchLength >= cctx->appliedParams.cParams.minMatch) {
                    /* Only ever split the match if it is larger than the block size */
                    U32 secondHalfMatchLength = currSeq.matchLength + currSeq.litLength - endPosInSequence;
                    if (secondHalfMatchLength < cctx->appliedParams.cParams.minMatch) {
                        /* Move the endPosInSequence backward so that it creates match of minMatch length */
                        endPosInSequence -= cctx->appliedParams.cParams.minMatch - secondHalfMatchLength;
                        bytesAdjustment = cctx->appliedParams.cParams.minMatch - secondHalfMatchLength;
                        firstHalfMatchLength -= bytesAdjustment;
                    }
                    matchLength = firstHalfMatchLength;
                    /* Flag that we split the last match - after storing the sequence, exit the loop,
                       but keep the value of endPosInSequence */
                    finalMatchSplit = 1;
                } else {
                    /* Move the position in sequence backwards so that we don't split match, and break to store
                     * the last literals. We use the original currSeq.litLength as a marker for where endPosInSequence
                     * should go. We prefer to do this whenever it is not necessary to split the match, or if doing so
                     * would cause the first half of the match to be too small
                     */
                    bytesAdjustment = endPosInSequence - currSeq.litLength;
                    endPosInSequence = currSeq.litLength;
                    break;
                }
            } else {
                /* This sequence ends inside the literals, break to store the last literals */
                break;
            }
        }
        /* Check if this offset can be represented with a repcode */
        {   U32 const ll0 = (litLength == 0);
            offBase = ZSTD_finalizeOffBase(rawOffset, updatedRepcodes.rep, ll0);
            ZSTD_updateRep(updatedRepcodes.rep, offBase, ll0);
        }

        if (cctx->appliedParams.validateSequences) {
            seqPos->posInSrc += litLength + matchLength;
            FORWARD_IF_ERROR(ZSTD_validateSequence(offBase, matchLength, cctx->appliedParams.cParams.minMatch, seqPos->posInSrc,
                                                   cctx->appliedParams.cParams.windowLog, dictSize, cctx->appliedParams.useSequenceProducer),
                                                   "Sequence validation failed");
        }
        DEBUGLOG(6, "Storing sequence: (of: %u, ml: %u, ll: %u)", offBase, matchLength, litLength);
        RETURN_ERROR_IF(idx - seqPos->idx >= cctx->seqStore.maxNbSeq, externalSequences_invalid,
                        "Not enough memory allocated. Try adjusting ZSTD_c_minMatch.");
        ZSTD_storeSeq(&cctx->seqStore, litLength, ip, iend, offBase, matchLength);
        ip += matchLength + litLength;
        if (!finalMatchSplit)
            idx++; /* Next Sequence */
    }
    DEBUGLOG(5, "Ending seq: idx: %u (of: %u ml: %u ll: %u)", idx, inSeqs[idx].offset, inSeqs[idx].matchLength, inSeqs[idx].litLength);
    assert(idx == inSeqsSize || endPosInSequence <= inSeqs[idx].litLength + inSeqs[idx].matchLength);
    seqPos->idx = idx;
    seqPos->posInSequence = endPosInSequence;
    ZSTD_memcpy(cctx->blockState.nextCBlock->rep, updatedRepcodes.rep, sizeof(repcodes_t));

    iend -= bytesAdjustment;
    if (ip != iend) {
        /* Store any last literals */
        U32 lastLLSize = (U32)(iend - ip);
        assert(ip <= iend);
        DEBUGLOG(6, "Storing last literals of size: %u", lastLLSize);
        ZSTD_storeLastLiterals(&cctx->seqStore, ip, lastLLSize);
        seqPos->posInSrc += lastLLSize;
    }

    return bytesAdjustment;
}